

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_add_element(p_ply ply,char *name,long ninstances)

{
  size_t sVar1;
  p_ply_element __dest;
  int iVar2;
  
  sVar1 = strlen(name);
  if ((ninstances < 0) || (0xff < sVar1)) {
    iVar2 = 0;
    ply_ferror(ply,"Invalid arguments");
  }
  else {
    __dest = ply_grow_element(ply);
    if (__dest == (p_ply_element)0x0) {
      iVar2 = 0;
    }
    else {
      strcpy(__dest->name,name);
      __dest->ninstances = ninstances;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int ply_add_element(p_ply ply, const char *name, long ninstances) {
    p_ply_element element = NULL;
    assert(ply && ply->fp && ply->io_mode == PLY_WRITE);
    assert(name && strlen(name) < WORDSIZE && ninstances >= 0);
    if (strlen(name) >= WORDSIZE || ninstances < 0) {
        ply_ferror(ply, "Invalid arguments");
        return 0;
    }
    element = ply_grow_element(ply);
    if (!element) return 0;
    strcpy(element->name, name);
    element->ninstances = ninstances;
    return 1;
}